

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

StructNew * __thiscall
wasm::Builder::makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,HeapType type,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args)

{
  uintptr_t in_RAX;
  StructNew *pSVar1;
  Type local_28;
  
  local_28.id = in_RAX;
  pSVar1 = MixedArena::alloc<wasm::StructNew>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pSVar1->operands,
             args);
  Type::Type(&local_28,type,NonNullable,Inexact);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id =
       local_28.id;
  ::wasm::StructNew::finalize();
  return pSVar1;
}

Assistant:

StructNew* makeStructNew(HeapType type, const T& args) {
    auto* ret = wasm.allocator.alloc<StructNew>();
    ret->operands.set(args);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }